

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O2

BOOL __thiscall
Js::TypedArray<float,_false,_false>::DirectSetItemAtRange
          (TypedArray<float,_false,_false> *this,TypedArray<float,_false,_false> *fromArray,
          int32 iSrcStart,int32 iDstStart,uint32 length,_func_float_Var_ScriptContext_ptr *convFunc)

{
  uint uVar1;
  Type puVar2;
  Type puVar3;
  JavascriptLibrary *pJVar4;
  code *pcVar5;
  bool bVar6;
  uint32 uVar7;
  undefined4 *puVar8;
  uint32 i;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  float fVar12;
  
  puVar2 = (this->super_TypedArrayBase).buffer;
  puVar3 = (fromArray->super_TypedArrayBase).buffer;
  if (puVar3 == (Type)0x0 || puVar2 == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x156,"(srcBuffer && dstBuffer)","srcBuffer && dstBuffer");
    if (!bVar6) goto LAB_009b0a01;
    *puVar8 = 0;
  }
  if (0x1fffffff < length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x157,
                                "(length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName))",
                                "length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName)");
    if (!bVar6) goto LAB_009b0a01;
    *puVar8 = 0;
  }
  if (iSrcStart != iDstStart) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x159,"(iSrcStart == iDstStart)","iSrcStart == iDstStart");
    if (!bVar6) goto LAB_009b0a01;
    *puVar8 = 0;
  }
  if ((((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached != false)
     || (((fromArray->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached ==
         true)) {
    JavascriptError::ThrowTypeError
              ((((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                   super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
  }
  if (iDstStart < 0) {
    if ((long)((long)iDstStart + (ulong)length) < 0) {
      return 1;
    }
    length = length + iDstStart;
    iDstStart = 0;
  }
  uVar7 = UInt32Math::Add(iDstStart,length);
  uVar1 = (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
  uVar10 = uVar1 - iDstStart;
  if (uVar1 < (uint)iDstStart) {
    uVar10 = 0;
  }
  if (uVar7 < uVar1) {
    uVar10 = length;
  }
  uVar1 = (fromArray->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
  uVar11 = uVar1 - iDstStart;
  if (uVar1 < (uint)iDstStart) {
    uVar11 = 0;
  }
  if (length + iDstStart < uVar1) {
    uVar11 = length;
  }
  if (length < uVar11) {
    uVar11 = length;
  }
  uVar1 = uVar10;
  if (uVar11 < uVar10) {
    uVar1 = uVar11;
  }
  uVar9 = (ulong)uVar1;
  if (uVar9 * 4 < uVar9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                ,0x175,"(byteSize >= length)","byteSize >= length");
    if (!bVar6) {
LAB_009b0a01:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  js_memcpy_s(puVar2 + (ulong)(uint)iDstStart * 4,(ulong)uVar10 * 4,
              puVar3 + (ulong)(uint)iDstStart * 4,uVar9 * 4);
  if (uVar11 < uVar10) {
    pJVar4 = (((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
               super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr;
    fVar12 = (*convFunc)((pJVar4->super_JavascriptLibraryBase).undefinedValue.ptr,
                         (pJVar4->super_JavascriptLibraryBase).scriptContext.ptr);
    for (; uVar9 < uVar10; uVar9 = uVar9 + 1) {
      *(float *)(puVar2 + uVar9 * 4) = fVar12;
    }
  }
  return 1;
}

Assistant:

inline BOOL DirectSetItemAtRange(TypedArray *fromArray, __in int32 iSrcStart, __in int32 iDstStart, __in uint32 length, TypeName(*convFunc)(Var value, ScriptContext* scriptContext))
        {
            TypeName* dstBuffer = (TypeName*)buffer;
            TypeName* srcBuffer = (TypeName*)fromArray->buffer;
            Assert(srcBuffer && dstBuffer);
            Assert(length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName));
            // caller checks that src and dst index are the same
            Assert(iSrcStart == iDstStart);

            if (this->IsDetachedBuffer() || fromArray->IsDetachedBuffer())
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }

            // Fixup destination start in case it's negative
            uint32 start = iDstStart;
            if (iDstStart < 0)
            {
                if ((int64)(length) + iDstStart < 0)
                {
                    // nothing to do, all index are no-op
                    return true;
                }

                length += iDstStart;
                start = 0;
            }

            uint32 dstLength = UInt32Math::Add(start, length) < GetLength() ? length : GetLength() > start ? GetLength() - start : 0;
            uint32 srcLength = start + length < fromArray->GetLength() ? length : (fromArray->GetLength() > start ? fromArray->GetLength() - start : 0);

            // length is the minimum of length, srcLength and dstLength
            length = length < srcLength ? (length < dstLength ? length : dstLength) : (srcLength < dstLength ? srcLength : dstLength);

            const size_t byteSize = sizeof(TypeName) * length;
            Assert(byteSize >= length); // check for overflow
            js_memcpy_s(dstBuffer + start, dstLength * sizeof(TypeName), srcBuffer + start, byteSize);

            if (dstLength > length)
            {
                TypeName undefinedValue = convFunc(GetLibrary()->GetUndefined(), GetScriptContext());
                for (uint32 i = length; i < dstLength; i++)
                {
                    dstBuffer[i] = undefinedValue;
                }
            }

            return true;
        }